

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
          (Fault *this,char *file,int line,int code,char *condition,char *macroArgs,PathPtr *params,
          PathPtr *params_1)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  String argValues [2];
  char **ppcVar4;
  undefined8 uVar5;
  char *local_78;
  size_t local_70;
  ArrayDisposer *pAStack_68;
  char *local_60;
  size_t sStack_58;
  ArrayDisposer *pAStack_50;
  String local_48;
  
  this->exception = (Exception *)0x0;
  PathPtr::toString(&local_48,params,false);
  local_78 = local_48.content.ptr;
  local_70 = local_48.content.size_;
  pAStack_68 = local_48.content.disposer;
  PathPtr::toString(&local_48,params_1,false);
  ppcVar4 = &local_78;
  local_60 = local_48.content.ptr;
  sStack_58 = local_48.content.size_;
  pAStack_50 = local_48.content.disposer;
  uVar5 = 2;
  init(this,(EVP_PKEY_CTX *)file);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_78 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_70 + lVar3);
      *(undefined8 *)((long)&local_78 + lVar3) = 0;
      *(undefined8 *)((long)&local_70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_68 + lVar3))
                (*(undefined8 **)((long)&pAStack_68 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}